

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dae.cpp
# Opt level: O2

Version __thiscall opencollada::Dae::getVersion(Dae *this)

{
  __type _Var1;
  Version VVar2;
  string root_namespace;
  
  XmlDoc::getRootNamespace_abi_cxx11_(&root_namespace,&this->super_XmlDoc);
  _Var1 = ::std::operator==(&root_namespace,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            mColladaNamespace141_abi_cxx11_);
  if (_Var1) {
    VVar2 = COLLADA14;
  }
  else {
    _Var1 = ::std::operator==(&root_namespace,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              mColladaNamespace15_abi_cxx11_);
    VVar2 = (uint)_Var1 * 2;
  }
  ::std::__cxx11::string::~string((string *)&root_namespace);
  return VVar2;
}

Assistant:

Dae::Version Dae::getVersion() const
	{
		string root_namespace = getRootNamespace();
		if (root_namespace == Dae::GetColladaNamespace141())
			return Version::COLLADA14;
		else if (root_namespace == Dae::GetColladaNamespace15())
			return Version::COLLADA15;
		return Version::Unknown;
	}